

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_chatserver.cpp
# Opt level: O1

int __thiscall ChatServer::qt_metacall(ChatServer *this,Call _c,int _id,void **_a)

{
  int _id_00;
  undefined4 in_register_00000014;
  
  _id_00 = QTcpServer::qt_metacall((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if (-1 < _id_00) {
    if (_c == RegisterMethodArgumentMetaType) {
      if (_id_00 < 6) {
        *(undefined8 *)*_a = 0;
      }
    }
    else {
      if (_c != InvokeMetaMethod) {
        return _id_00;
      }
      if (_id_00 < 6) {
        qt_static_metacall((QObject *)this,InvokeMetaMethod,_id_00,_a);
      }
    }
    _id_00 = _id_00 + -6;
  }
  return _id_00;
}

Assistant:

int ChatServer::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QTcpServer::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 6)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 6;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 6)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 6;
    }
    return _id;
}